

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort *puVar3;
  u8 *puVar4;
  char *pcVar5;
  ushort *puVar6;
  ushort uVar7;
  ulong uVar8;
  long lVar9;
  ushort *__dest;
  ushort *__src;
  ulong uVar10;
  
  uVar8 = (ulong)pPg->hdrOffset;
  puVar3 = (ushort *)pPg->aData;
  lVar9 = (long)(int)pPg->pBt->usableSize;
  puVar2 = (ushort *)((long)puVar3 + lVar9);
  puVar4 = pPg->aCellIdx;
  pcVar5 = pPg->pBt->pPager->pTmpSpace;
  uVar7 = *(ushort *)((long)puVar3 + uVar8 + 5);
  uVar10 = (ulong)(ushort)(uVar7 << 8 | uVar7 >> 8);
  memcpy(pcVar5 + uVar10,(void *)(uVar10 + (long)puVar3),lVar9 - uVar10);
  __dest = puVar2;
  if (0 < nCell) {
    uVar10 = 0;
    do {
      __dest = (ushort *)((long)__dest - (ulong)szCell[uVar10]);
      uVar7 = (short)__dest - (short)puVar3;
      puVar6 = (ushort *)apCell[uVar10];
      puVar1 = (ushort *)(puVar4 + uVar10 * 2);
      *puVar1 = uVar7 * 0x100 | uVar7 >> 8;
      if (__dest < puVar1 + 1) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10278,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      }
      else {
        __src = (ushort *)((long)puVar6 + ((long)pcVar5 - (long)puVar3));
        if (puVar2 <= puVar6) {
          __src = puVar6;
        }
        if (puVar6 < puVar3) {
          __src = puVar6;
        }
        memcpy(__dest,__src,(ulong)szCell[uVar10]);
      }
      if (__dest < puVar1 + 1) {
        return 0xb;
      }
      uVar10 = uVar10 + 1;
    } while ((uint)nCell != uVar10);
  }
  pPg->nCell = (u16)nCell;
  pPg->nOverflow = '\0';
  *(undefined2 *)((long)puVar3 + uVar8 + 1) = 0;
  *(undefined1 *)((long)puVar3 + uVar8 + 3) = *(undefined1 *)((long)&pPg->nCell + 1);
  *(char *)((long)puVar3 + uVar8 + 4) = (char)pPg->nCell;
  *(char *)((long)puVar3 + uVar8 + 5) = (char)((ulong)((long)__dest - (long)puVar3) >> 8);
  *(char *)((long)puVar3 + uVar8 + 6) = (char)((long)__dest - (long)puVar3);
  *(undefined1 *)((long)puVar3 + uVar8 + 7) = 0;
  return 0;
}

Assistant:

static int rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, szCell[i]);
    assert( szCell[i]==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( szCell[i]!=pPg->xCellSize(pPg,pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}